

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::DisableIffAssertionExpr::fromSyntax
          (DisableIffSyntax *syntax,AssertionExpr *expr,ASTContext *context)

{
  Compilation *this;
  Expression *expr_00;
  DisableIffAssertionExpr *pDVar1;
  SourceRange sourceRange;
  
  this = ((context->scope).ptr)->compilation;
  expr_00 = bindExpr((syntax->expr).ptr,context,false,true);
  AssertionExpr::checkSampledValueExpr(expr_00,context,false,(DiagCode)0x150008,(DiagCode)0x160008);
  if ((context->assertionInstance != (AssertionInstanceDetails *)0x0) &&
     (context->assertionInstance->isRecursive == true)) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x3d0008,sourceRange);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
                     (&this->super_BumpAllocator,expr_00,expr);
  return &pDVar1->super_AssertionExpr;
}

Assistant:

AssertionExpr& DisableIffAssertionExpr::fromSyntax(const DisableIffSyntax& syntax,
                                                   const AssertionExpr& expr,
                                                   const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.expr, context);

    checkSampledValueExpr(cond, context, false, diag::DisableIffLocalVar, diag::DisableIffMatched);

    if (context.assertionInstance && context.assertionInstance->isRecursive)
        context.addDiag(diag::RecursivePropDisableIff, syntax.sourceRange());

    return *comp.emplace<DisableIffAssertionExpr>(cond, expr);
}